

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall cs::exception::exception(exception *this,exception *param_1)

{
  *(undefined ***)this = &PTR__exception_0023ecf8;
  this->mLine = param_1->mLine;
  std::__cxx11::string::string((string *)&this->mFile,(string *)&param_1->mFile);
  std::__cxx11::string::string((string *)&this->mCode,(string *)&param_1->mCode);
  std::__cxx11::string::string((string *)&this->mWhat,(string *)&param_1->mWhat);
  std::__cxx11::string::string((string *)&this->mStr,(string *)&param_1->mStr);
  return;
}

Assistant:

exception(const exception &) = default;